

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_grpc.cpp
# Opt level: O0

void __thiscall flatbuffers::FlatBufPrinter::Print(FlatBufPrinter *this,char *s)

{
  char cVar1;
  string *psVar2;
  char *__beg;
  char *__end;
  allocator<char> local_59;
  string local_58 [32];
  char *local_38;
  char *lf;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  char *local_18;
  char *s_local;
  FlatBufPrinter *this_local;
  
  if (s != (char *)0x0) {
    cVar1 = *s;
    s_local = (char *)this;
    local_18 = s;
    while (cVar1 != '\0') {
      psVar2 = this->str_;
      local_28._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_20,&local_28);
      lf = (char *)std::__cxx11::string::insert
                             (psVar2,local_20,this->indent_ * this->indentation_size_,
                              (int)this->indentation_type_);
      local_38 = strchr(local_18,10);
      __beg = local_18;
      if (local_38 == (char *)0x0) {
        std::__cxx11::string::operator+=((string *)this->str_,local_18);
        return;
      }
      __end = local_38 + 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<char_const*,void>(local_58,__beg,__end,&local_59);
      std::__cxx11::string::operator+=((string *)this->str_,local_58);
      std::__cxx11::string::~string(local_58);
      std::allocator<char>::~allocator(&local_59);
      local_18 = local_38 + 1;
      cVar1 = *local_18;
    }
  }
  return;
}

Assistant:

void Print(const char *s) {
    if (s == nullptr || *s == '\0') { return; }
    // Add this string, but for each part separated by \n, add indentation.
    for (;;) {
      // Current indentation.
      str_->insert(str_->end(), indent_ * indentation_size_, indentation_type_);
      // See if this contains more than one line.
      const char *lf = strchr(s, '\n');
      if (lf) {
        (*str_) += std::string(s, lf + 1);
        s = lf + 1;
        if (!*s) break;  // Only continue if there's more lines.
      } else {
        (*str_) += s;
        break;
      }
    }
  }